

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Screen.cpp
# Opt level: O2

bool __thiscall Screen::displayText(Screen *this,string *text)

{
  uint uVar1;
  WINDOW **ppWVar2;
  ulong uVar3;
  long lVar4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  textFragments;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  local_68.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_68.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  if (this->animationMode == false) {
    updateInfo(this);
    wclear(this->textScreen);
    ppWVar2 = &this->textScreen;
    uVar3 = text->_M_string_length;
    if ((uint)this->textMaxLength < uVar3) {
      uVar1 = 0;
      while (this->currPosition = uVar1, uVar1 < uVar3) {
        std::__cxx11::string::substr((ulong)&local_48,(ulong)text);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_68,
                   &local_48);
        std::__cxx11::string::~string((string *)&local_48);
        uVar3 = text->_M_string_length;
        uVar1 = this->currPosition + this->textMaxLength;
      }
      uVar3 = (ulong)this->currentFragment;
      lVar4 = uVar3 << 5;
      for (; (uVar3 & 0xffffffff) <
             (ulong)((long)local_68.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)local_68.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 5); uVar3 = uVar3 + 1) {
        wclear(*ppWVar2);
        wprintw(*ppWVar2,*(undefined8 *)
                          ((long)&((local_68.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                          lVar4));
        wrefresh(*ppWVar2);
        if (((long)local_68.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)local_68.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 5) - 1U == (uVar3 & 0xffffffff)) {
          this->currentFragment = 0;
          refreshInput(this);
        }
        else {
          indicateMoreText(this);
        }
        this->currentFragment = this->currentFragment + 1;
        lVar4 = lVar4 + 0x20;
      }
      goto LAB_00118992;
    }
    std::__cxx11::string::_M_assign((string *)&this->currentText);
    wprintw(*ppWVar2,(this->currentText)._M_dataplus._M_p);
  }
  else {
    wprintw(this->animationScreen,(text->_M_dataplus)._M_p);
    ppWVar2 = &this->animationScreen;
  }
  wrefresh(*ppWVar2);
LAB_00118992:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_68);
  return true;
}

Assistant:

bool Screen::displayText(std::string text) {
    int i;
    std::vector<std::string> textFragments;

    if(!animationMode){
        // Update the info area
        updateInfo();

        // Remove any unwanted text
        clearWindow(textScreen);

        // Print the message
        if (text.length() > (unsigned int)textMaxLength){
            currPosition = 0;
            while((unsigned int)currPosition < text.length()){
                textFragments.push_back(text.substr((unsigned long)currPosition, (unsigned long)(currPosition + textMaxLength)));
                currPosition += textMaxLength;
            }

            for(i = currentFragment; (unsigned int)i < textFragments.size(); i++, currentFragment++){
                wclear(textScreen);
                wprintw(textScreen, textFragments[i].c_str());
                wrefresh(textScreen);

                // Reset the counter
                if((unsigned int)i == textFragments.size() - 1){
                    currentFragment = 0;
                    refreshInput();
                    continue;
                }
                else {
                    indicateMoreText();
                }
            }
        }
        else {
            currentText = text;
            wprintw(textScreen, currentText.c_str());

            // Display the message
            wrefresh(textScreen);
        }



        return true;
    }
    else{
        // Print the message
        wprintw(animationScreen, text.c_str());

        // Display the message
        wrefresh(animationScreen);

        return true;
    }
}